

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_TubeResonator.cpp
# Opt level: O2

void __thiscall TubeResonator::Delay::Process(Delay *this)

{
  int iVar1;
  float __x;
  float fVar2;
  
  iVar1 = this->writepos;
  this->data[iVar1] = this->input;
  __x = (float)(iVar1 + 0xff) - this->delay;
  fVar2 = floorf(__x);
  this->writepos = iVar1 + 1U & 0xff;
  this->output = (this->data[(int)fVar2 + 1U & 0xff] - this->data[(int)fVar2 & 0xff]) *
                 (__x - (float)(int)fVar2) + this->data[(int)fVar2 & 0xff];
  return;
}

Assistant:

inline void Process()
        {
            data[writepos] = input;
            float f = writepos + MASK - delay;
            int r = FastFloor(f);
            f -= r;
            r &= MASK;
            writepos = (writepos + 1) & MASK;
            float s1 = data[r & MASK];
            float s2 = data[(r + 1) & MASK];
            output = s1 + (s2 - s1) * f;
        }